

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::printDMA(InstanceData *inst)

{
  uint uVar1;
  uint uVar2;
  uint *puStack_18;
  uint32 qwc;
  uint32 *tag;
  InstanceData *inst_local;
  
  puStack_18 = (uint *)inst->data;
  do {
    while( true ) {
      while( true ) {
        uVar1 = (uint)(ushort)*puStack_18;
        uVar2 = *puStack_18 & 0x70000000;
        if (uVar2 != 0x10000000) break;
        printf("CNT %04x %08x\n",(ulong)uVar1,(ulong)puStack_18[1]);
        puStack_18 = puStack_18 + (uVar1 + 1) * 4;
      }
      if (uVar2 != 0x30000000) break;
      printf("REF %04x %08x\n",(ulong)uVar1,(ulong)puStack_18[1]);
      puStack_18 = puStack_18 + 4;
    }
  } while (uVar2 != 0x60000000);
  printf("RET %04x %08x\n\n",(ulong)uVar1,(ulong)puStack_18[1]);
  return;
}

Assistant:

void
printDMA(InstanceData *inst)
{
	uint32 *tag = (uint32*)inst->data;
	uint32 qwc;
	for(;;){
		qwc = tag[0]&0xFFFF;
		switch(tag[0]&0x70000000){
		case DMAcnt:
			printf("CNT %04x %08x\n", qwc, tag[1]);
			tag += (1+qwc)*4;
			break;

		case DMAref:
			printf("REF %04x %08x\n", qwc, tag[1]);
			tag += 4;
			break;

		case DMAret:
			printf("RET %04x %08x\n\n", qwc, tag[1]);
			return;
		}
	}
}